

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pos_tagger_test.cpp
# Opt level: O0

void __thiscall PosTaggerTest_Test_Test::TestBody(PosTaggerTest_Test_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar_;
  string s;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  res;
  MixSegment tagger;
  string *in_stack_fffffffffffffdb8;
  undefined6 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc6;
  undefined1 in_stack_fffffffffffffdc7;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  string *userDict;
  int line;
  string *hmmSegDict;
  string *mpSegDict;
  Type type;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  Message *in_stack_fffffffffffffe18;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  AssertionResult *in_stack_fffffffffffffe38;
  undefined1 local_1b1 [64];
  undefined1 local_171 [40];
  undefined1 local_149 [56];
  undefined1 local_111 [137];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  
  mpSegDict = (string *)local_111;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  hmmSegDict = (string *)local_149;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  userDict = (string *)local_171;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  cppjieba::MixSegment::MixSegment
            ((MixSegment *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),mpSegDict,
             hmmSegDict,userDict);
  type = (Type)((ulong)mpSegDict >> 0x20);
  line = (int)((ulong)userDict >> 0x20);
  std::__cxx11::string::~string((string *)(local_171 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_171);
  std::__cxx11::string::~string((string *)(local_149 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_149);
  std::__cxx11::string::~string((string *)(local_111 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_111);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x1d12d8);
  this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  cppjieba::MixSegment::Tag
            ((MixSegment *)
             CONCAT17(in_stack_fffffffffffffdc7,
                      CONCAT16(in_stack_fffffffffffffdc6,in_stack_fffffffffffffdc0)),
             in_stack_fffffffffffffdb8,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x1d1322);
  std::__cxx11::string::~string((string *)(local_1b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1b1);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe28);
  std::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffdc7,
                                   CONCAT16(in_stack_fffffffffffffdc6,in_stack_fffffffffffffdc0)),
                          (char *)in_stack_fffffffffffffdb8);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffdc6,in_stack_fffffffffffffdc0)),
             SUB81((ulong)in_stack_fffffffffffffdb8 >> 0x38,0));
  uVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffe18);
  if (!(bool)uVar2) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    testing::internal::GetBoolAssertionFailureMessage
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
               (char *)in_stack_fffffffffffffe20.ptr_);
    testing::internal::String::c_str((String *)&stack0xfffffffffffffdf8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),type,
               (char *)hmmSegDict,line,(char *)this_00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffe20.ptr_,in_stack_fffffffffffffe18);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffdc0)));
    testing::internal::String::~String
              ((String *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffdc0)));
    testing::Message::~Message((Message *)0x1d1569);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d15e5);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(this_00);
  cppjieba::MixSegment::~MixSegment
            ((MixSegment *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffdc0)));
  return;
}

Assistant:

TEST(PosTaggerTest, Test) {
  MixSegment tagger("../dict/jieba.dict.utf8", "../dict/hmm_model.utf8");
  {
    vector<pair<string, string> > res;
    tagger.Tag(QUERY_TEST1, res);
    string s;
    s << res;
    ASSERT_TRUE(s == ANS_TEST1);
  }
}